

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O3

void ApplicativeHelper::getHeadAndArgs(Term *term,TermList *head,TermStack *args)

{
  uint64_t uVar1;
  bool bVar2;
  TermList *pTVar3;
  
  if (args->_cursor != args->_stack) {
    args->_cursor = args->_stack;
  }
  head->_content = (uint64_t)term;
  bVar2 = Kernel::Term::isApplication(term);
  if (bVar2) {
    do {
      uVar1 = term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 3]._content;
      pTVar3 = args->_cursor;
      if (pTVar3 == args->_end) {
        Lib::Stack<Kernel::TermList>::expand(args);
        pTVar3 = args->_cursor;
      }
      pTVar3->_content = uVar1;
      args->_cursor = pTVar3 + 1;
      term = (Term *)term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 2]._content;
      head->_content = (uint64_t)term;
    } while ((((ulong)term & 3) == 0) && (bVar2 = Kernel::Term::isApplication(term), bVar2));
  }
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(Term* term, TermList& head, TermStack& args)
{
  if(!args.isEmpty()){ args.reset(); }

  head = TermList(term);

  while(term->isApplication()){
    args.push(*term->nthArgument(3)); 
    head = *term->nthArgument(2);
    if(head.isTerm()){ 
      term = head.term();
    } else { break; }
  }

}